

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O1

void write_register(YMF271Chip *chip,int slotnum,int reg,UINT8 data)

{
  UINT8 UVar1;
  int iVar2;
  byte bVar3;
  double dVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  INT32 IVar9;
  
  if (0xe < (uint)reg) {
    return;
  }
  switch(reg) {
  case 1:
    chip->slots[slotnum].lfoFreq = data;
    return;
  case 2:
    chip->slots[slotnum].lfowave = data & 3;
    chip->slots[slotnum].pms = data >> 3 & 7;
    chip->slots[slotnum].ams = data >> 6;
    return;
  case 3:
    chip->slots[slotnum].multiple = data & 0xf;
    chip->slots[slotnum].detune = data >> 4 & 7;
    return;
  case 4:
    chip->slots[slotnum].tl = data & 0x7f;
    return;
  case 5:
    chip->slots[slotnum].ar = data & 0x1f;
    chip->slots[slotnum].keyscale = data >> 5;
    return;
  case 6:
    chip->slots[slotnum].decay1rate = data & 0x1f;
    return;
  case 7:
    chip->slots[slotnum].decay2rate = data & 0x1f;
    return;
  case 8:
    chip->slots[slotnum].relrate = data & 0xf;
    chip->slots[slotnum].decay1lvl = data >> 4;
    return;
  case 9:
    uVar8 = *(uint *)&chip->slots[slotnum].fns_hi;
    chip->slots[slotnum].fns = (uint)data | (uVar8 & 0xf) << 8;
    chip->slots[slotnum].block = (byte)uVar8 >> 4;
    return;
  case 10:
    chip->slots[slotnum].fns_hi = data;
    return;
  case 0xb:
    chip->slots[slotnum].waveform = data & 7;
    chip->slots[slotnum].feedback = data >> 4 & 7;
    chip->slots[slotnum].accon = data >> 7;
    return;
  case 0xc:
    chip->slots[slotnum].algorithm = data & 0xf;
    return;
  case 0xd:
    chip->slots[slotnum].ch0_level = data >> 4;
    chip->slots[slotnum].ch1_level = data & 0xf;
    return;
  case 0xe:
    chip->slots[slotnum].ch2_level = data >> 4;
    chip->slots[slotnum].ch3_level = data & 0xf;
    return;
  }
  chip->slots[slotnum].ext_en = data >> 7;
  chip->slots[slotnum].ext_out = data >> 3 & 0xf;
  if ((data & 1) == 0) {
    if (chip->slots[slotnum].active == '\0') {
      return;
    }
    chip->slots[slotnum].env_state = 3;
    return;
  }
  chip->slots[slotnum].step = 0;
  chip->slots[slotnum].stepptr = 0;
  chip->slots[slotnum].active = '\x01';
  UVar1 = chip->slots[slotnum].waveform;
  uVar8 = chip->slots[slotnum].fns * 2;
  if (UVar1 == '\a') {
    dVar4 = (double)(uVar8 | 0x1000) * pow_table[chip->slots[slotnum].block] *
            fs_frequency[chip->slots[slotnum].fs] * multiple_table[chip->slots[slotnum].multiple] *
            chip->slots[slotnum].lfo_phasemod * 0.125;
  }
  else {
    dVar4 = (double)uVar8 * pow_table[chip->slots[slotnum].block] *
            multiple_table[chip->slots[slotnum].multiple] * 1024.0 *
            chip->slots[slotnum].lfo_phasemod * 0.0001220703125;
  }
  chip->slots[slotnum].step = (UINT32)(long)dVar4;
  if ((slotnum & 3U) == 0) {
    cVar5 = (char)(slotnum / 0xc);
    bVar3 = ((char)slotnum + cVar5 * -0xc & 0x1cU) + cVar5 & 0x1f;
    chip->end_status =
         chip->end_status & ((ushort)(-2 << bVar3) | (ushort)(0xfffffffe >> 0x20 - bVar3));
  }
  uVar8 = chip->slots[slotnum].fns;
  if (UVar1 == '\a') {
    uVar8 = uVar8 & 0x7ff;
    if (0xff < uVar8) {
      uVar7 = 1;
      if (0x2ff < uVar8) {
        uVar7 = 3 - (ulong)(uVar8 < 0x500);
      }
      goto LAB_0015cb02;
    }
  }
  else if (0x77f < (int)uVar8) {
    uVar7 = 1;
    if (0x8ff < (int)uVar8) {
      uVar7 = (ulong)((int)uVar8 < 0xa80) ^ 3;
    }
    goto LAB_0015cb02;
  }
  uVar7 = 0;
LAB_0015cb02:
  iVar2 = RKS_Table[(chip->slots[slotnum].block & 7) << 2 | uVar7][chip->slots[slotnum].keyscale];
  uVar8 = iVar2 + (uint)chip->slots[slotnum].ar * 2;
  iVar6 = 0;
  IVar9 = 0;
  if (3 < (int)uVar8) {
    uVar7 = 0x3f;
    if ((int)uVar8 < 0x3f) {
      uVar7 = (ulong)uVar8;
    }
    IVar9 = (INT32)((255.0 / chip->lut_ar[uVar7]) * 65536.0);
  }
  bVar3 = chip->slots[slotnum].decay1lvl;
  chip->slots[slotnum].env_attack_step = IVar9;
  uVar8 = iVar2 + (uint)chip->slots[slotnum].decay1rate * 2;
  if (3 < (int)uVar8) {
    uVar7 = 0x3f;
    if ((int)uVar8 < 0x3f) {
      uVar7 = (ulong)uVar8;
    }
    iVar6 = (int)(((double)((uint)bVar3 << 4) / chip->lut_dc[uVar7]) * 65536.0);
  }
  chip->slots[slotnum].env_decay1_step = iVar6;
  uVar8 = iVar2 + (uint)chip->slots[slotnum].decay2rate * 2;
  iVar6 = 0;
  IVar9 = 0;
  if (3 < (int)uVar8) {
    uVar7 = 0x3f;
    if ((int)uVar8 < 0x3f) {
      uVar7 = (ulong)uVar8;
    }
    IVar9 = (INT32)((255.0 / chip->lut_dc[uVar7]) * 65536.0);
  }
  chip->slots[slotnum].env_decay2_step = IVar9;
  uVar8 = iVar2 + (uint)chip->slots[slotnum].relrate * 4;
  if (3 < (int)uVar8) {
    uVar7 = 0x3f;
    if ((int)uVar8 < 0x3f) {
      uVar7 = (ulong)uVar8;
    }
    iVar6 = (int)((255.0 / chip->lut_ar[uVar7]) * 65536.0);
  }
  chip->slots[slotnum].env_release_step = iVar6;
  chip->slots[slotnum].volume = 0x5f0000;
  chip->slots[slotnum].env_state = 0;
  chip->slots[slotnum].lfo_phase = 0;
  chip->slots[slotnum].lfo_amplitude = 0;
  chip->slots[slotnum].lfo_phasemod = 0.0;
  chip->slots[slotnum].lfo_step =
       (int)(((chip->lut_lfo[chip->slots[slotnum].lfoFreq] * 256.0) / 44100.0) * 256.0);
  chip->slots[slotnum].feedback_modulation0 = 0;
  chip->slots[slotnum].feedback_modulation1 = 0;
  return;
}

Assistant:

static void write_register(YMF271Chip *chip, int slotnum, int reg, UINT8 data)
{
	YMF271Slot *slot = &chip->slots[slotnum];

	switch (reg)
	{
		case 0x0:
			slot->ext_en = (data & 0x80) ? 1 : 0;
			slot->ext_out = (data>>3)&0xf;

			if (data & 1)
			{
				// key on
				slot->step = 0;
				slot->stepptr = 0;

				slot->active = 1;

				calculate_step(slot);
				calculate_status_end(chip,slotnum,0);
				init_envelope(chip, slot);
				init_lfo(chip, slot);
				slot->feedback_modulation0 = 0;
				slot->feedback_modulation1 = 0;
			}
			else
			{
				if (slot->active)
				{
					slot->env_state = ENV_RELEASE;
				}
			}
			break;

		case 0x1:
			slot->lfoFreq = data;
			break;

		case 0x2:
			slot->lfowave = data & 3;
			slot->pms = (data >> 3) & 0x7;
			slot->ams = (data >> 6) & 0x3;
			break;

		case 0x3:
			slot->multiple = data & 0xf;
			slot->detune = (data >> 4) & 0x7;
			break;

		case 0x4:
			slot->tl = data & 0x7f;
			break;

		case 0x5:
			slot->ar = data & 0x1f;
			slot->keyscale = (data >> 5) & 0x7;
			break;

		case 0x6:
			slot->decay1rate = data & 0x1f;
			break;

		case 0x7:
			slot->decay2rate = data & 0x1f;
			break;

		case 0x8:
			slot->relrate = data & 0xf;
			slot->decay1lvl = (data >> 4) & 0xf;
			break;

		case 0x9:
			// write frequency and block here
			slot->fns = (slot->fns_hi << 8 & 0x0f00) | data;
			slot->block = slot->fns_hi >> 4 & 0xf;
			break;

		case 0xa:
			slot->fns_hi = data;
			break;

		case 0xb:
			slot->waveform = data & 0x7;
			slot->feedback = (data >> 4) & 0x7;
			slot->accon = (data & 0x80) ? 1 : 0;
			break;

		case 0xc:
			slot->algorithm = data & 0xf;
			break;

		case 0xd:
			slot->ch0_level = data >> 4;
			slot->ch1_level = data & 0xf;
			break;

		case 0xe:
			slot->ch2_level = data >> 4;
			slot->ch3_level = data & 0xf;
			break;

		default:
			break;
	}
}